

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall llbuild::ninja::Lexer::lexIdentifier(Lexer *this,Token *result)

{
  byte *pbVar1;
  byte bVar2;
  
  while( true ) {
    pbVar1 = (byte *)this->bufferPos;
    if (pbVar1 == (byte *)((this->buffer).Data + (this->buffer).Length)) {
      bVar2 = 0xff;
    }
    else {
      bVar2 = *pbVar1;
    }
    if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
       ((0x32 < bVar2 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) == 0))))
    break;
    getNextChar(this);
  }
  if (this->mode == IdentifierSpecific) {
    result->tokenKind = Identifier;
    result->length = (int)pbVar1 - *(int *)&result->start;
  }
  else {
    setIdentifierTokenKind(this,result);
  }
  return result;
}

Assistant:

Token& Lexer::lexIdentifier(Token& result) {
  // Consume characters as long as we are in an identifier.
  while (Lexer::isIdentifierChar(peekNextChar())) {
    getNextChar();
  }

  // If we are in identifier specific mode, ignore keywords.
  if (mode == Lexer::LexingMode::IdentifierSpecific)
    return setTokenKind(result, Token::Kind::Identifier);

  // Recognize keywords specially.
  return setIdentifierTokenKind(result);
}